

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode cf_h2_ctx_init(Curl_cfilter *cf,Curl_easy *data,_Bool via_h1_upgrade)

{
  bufc_pool *pool;
  undefined8 *puVar1;
  nghttp2_session **session_ptr;
  nghttp2_session_callbacks *callbacks;
  stream_ctx *psVar2;
  int iVar3;
  CURLcode CVar4;
  uint error_code;
  size_t settings_payloadlen;
  char *pcVar5;
  char *fmt;
  nghttp2_session_callbacks *cbs;
  stream_ctx *stream;
  nghttp2_option *o;
  nghttp2_session_callbacks *local_a0;
  stream_ctx *local_98;
  stream_ctx *local_90;
  nghttp2_settings_entry local_88;
  undefined8 local_80;
  undefined4 local_78;
  uint local_74;
  
  puVar1 = (undefined8 *)cf->ctx;
  local_a0 = (nghttp2_session_callbacks *)0x0;
  pool = (bufc_pool *)(puVar1 + 0x13);
  Curl_bufcp_init(pool,0x4000,0x280);
  Curl_bufq_initp((bufq *)(puVar1 + 3),pool,0x280,0);
  Curl_bufq_initp((bufq *)(puVar1 + 0xb),pool,1,0);
  *(undefined4 *)((long)puVar1 + 0xc4) = 0x7fffffff;
  iVar3 = nghttp2_session_callbacks_new(&local_a0);
  if (iVar3 == 0) {
    nghttp2_session_callbacks_set_send_callback(local_a0,send_callback);
    nghttp2_session_callbacks_set_on_frame_recv_callback(local_a0,on_frame_recv);
    nghttp2_session_callbacks_set_on_frame_send_callback(local_a0,on_frame_send);
    nghttp2_session_callbacks_set_on_data_chunk_recv_callback(local_a0,on_data_chunk_recv);
    nghttp2_session_callbacks_set_on_stream_close_callback(local_a0,on_stream_close);
    nghttp2_session_callbacks_set_on_begin_headers_callback(local_a0,on_begin_headers);
    nghttp2_session_callbacks_set_on_header_callback(local_a0,on_header);
    nghttp2_session_callbacks_set_error_callback(local_a0,error_callback);
    callbacks = local_a0;
    session_ptr = (nghttp2_session **)cf->ctx;
    iVar3 = nghttp2_option_new((nghttp2_option **)&local_88);
    if (iVar3 == 0) {
      nghttp2_option_set_no_auto_window_update
                ((nghttp2_option *)CONCAT44(local_88.value,local_88.settings_id),1);
      nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation
                ((nghttp2_option *)CONCAT44(local_88.value,local_88.settings_id),1);
      iVar3 = nghttp2_session_client_new2
                        (session_ptr,callbacks,cf,
                         (nghttp2_option *)CONCAT44(local_88.value,local_88.settings_id));
      nghttp2_option_del((nghttp2_option *)CONCAT44(local_88.value,local_88.settings_id));
      if (iVar3 == 0) {
        *(undefined4 *)(puVar1 + 1) = 100;
        if (via_h1_upgrade) {
          settings_payloadlen = populate_binsettings((uint8_t *)&local_88,data);
          if ((long)settings_payloadlen < 1) {
            Curl_failf(data,"nghttp2 unexpectedly failed on pack_settings_payload");
            CVar4 = CURLE_FAILED_INIT;
            goto LAB_005db24f;
          }
          CVar4 = http2_data_setup((Curl_cfilter *)cf->ctx,data,&local_90);
          if (CVar4 != CURLE_OK) goto LAB_005db24f;
          local_98 = local_90;
          local_90->id = 1;
          error_code = nghttp2_session_upgrade2
                                 ((nghttp2_session *)*puVar1,(uint8_t *)&local_88,
                                  settings_payloadlen,(uint)((data->state).httpreq == '\x05'),
                                  (void *)0x0);
          psVar2 = local_98;
          if (error_code == 0) {
            iVar3 = nghttp2_session_set_stream_user_data
                              ((nghttp2_session *)*puVar1,local_98->id,data);
            if ((iVar3 != 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"http/2: failed to set user_data for stream %u",
                         (ulong)(uint)psVar2->id);
            }
            if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"created session via Upgrade");
            }
            goto LAB_005db3f4;
          }
          pcVar5 = nghttp2_strerror(error_code);
          fmt = "nghttp2_session_upgrade2() failed: %s(%d)";
        }
        else {
          local_88.settings_id = 3;
          local_88.value = Curl_multi_max_concurrent_streams(data->multi);
          local_80 = 0xa0000000000004;
          local_78 = 2;
          local_74 = (uint)(data->multi->push_cb != (curl_push_callback)0x0);
          error_code = nghttp2_submit_settings((nghttp2_session *)*puVar1,'\0',&local_88,3);
          if (error_code == 0) {
LAB_005db3f4:
            CVar4 = CURLE_OK;
            error_code = nghttp2_session_set_local_window_size
                                   ((nghttp2_session *)*puVar1,'\0',0,0x3e800000);
            if (error_code == 0) {
              if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
                pcVar5 = "";
                if (via_h1_upgrade) {
                  pcVar5 = " (via h1 upgrade)";
                }
                CVar4 = CURLE_OK;
                Curl_trc_cf_infof(data,cf,"[0] created h2 session%s",pcVar5);
              }
              goto LAB_005db24f;
            }
            pcVar5 = nghttp2_strerror(error_code);
            fmt = "nghttp2_session_set_local_window_size() failed: %s(%d)";
          }
          else {
            pcVar5 = nghttp2_strerror(error_code);
            fmt = "nghttp2_submit_settings() failed: %s(%d)";
          }
        }
        Curl_failf(data,fmt,pcVar5,(ulong)error_code);
        CVar4 = CURLE_HTTP2;
        goto LAB_005db24f;
      }
    }
    pcVar5 = "Couldn\'t initialize nghttp2";
  }
  else {
    pcVar5 = "Couldn\'t initialize nghttp2 callbacks";
  }
  Curl_failf(data,pcVar5);
  CVar4 = CURLE_OUT_OF_MEMORY;
LAB_005db24f:
  if (local_a0 != (nghttp2_session_callbacks *)0x0) {
    nghttp2_session_callbacks_del(local_a0);
  }
  return CVar4;
}

Assistant:

static CURLcode cf_h2_ctx_init(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool via_h1_upgrade)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  int rc;
  nghttp2_session_callbacks *cbs = NULL;

  DEBUGASSERT(!ctx->h2);
  Curl_bufcp_init(&ctx->stream_bufcp, H2_CHUNK_SIZE, H2_STREAM_POOL_SPARES);
  Curl_bufq_initp(&ctx->inbufq, &ctx->stream_bufcp, H2_NW_RECV_CHUNKS, 0);
  Curl_bufq_initp(&ctx->outbufq, &ctx->stream_bufcp, H2_NW_SEND_CHUNKS, 0);
  ctx->last_stream_id = 2147483647;

  rc = nghttp2_session_callbacks_new(&cbs);
  if(rc) {
    failf(data, "Couldn't initialize nghttp2 callbacks");
    goto out;
  }

  nghttp2_session_callbacks_set_send_callback(cbs, send_callback);
  nghttp2_session_callbacks_set_on_frame_recv_callback(cbs, on_frame_recv);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  nghttp2_session_callbacks_set_on_frame_send_callback(cbs, on_frame_send);
#endif
  nghttp2_session_callbacks_set_on_data_chunk_recv_callback(
    cbs, on_data_chunk_recv);
  nghttp2_session_callbacks_set_on_stream_close_callback(cbs, on_stream_close);
  nghttp2_session_callbacks_set_on_begin_headers_callback(
    cbs, on_begin_headers);
  nghttp2_session_callbacks_set_on_header_callback(cbs, on_header);
  nghttp2_session_callbacks_set_error_callback(cbs, error_callback);

  /* The nghttp2 session is not yet setup, do it */
  rc = h2_client_new(cf, cbs);
  if(rc) {
    failf(data, "Couldn't initialize nghttp2");
    goto out;
  }
  ctx->max_concurrent_streams = DEFAULT_MAX_CONCURRENT_STREAMS;

  if(via_h1_upgrade) {
    /* HTTP/1.1 Upgrade issued. H2 Settings have already been submitted
     * in the H1 request and we upgrade from there. This stream
     * is opened implicitly as #1. */
    uint8_t binsettings[H2_BINSETTINGS_LEN];
    ssize_t binlen; /* length of the binsettings data */

    binlen = populate_binsettings(binsettings, data);
    if(binlen <= 0) {
      failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
      result = CURLE_FAILED_INIT;
      goto out;
    }

    result = http2_data_setup(cf, data, &stream);
    if(result)
      goto out;
    DEBUGASSERT(stream);
    stream->id = 1;
    /* queue SETTINGS frame (again) */
    rc = nghttp2_session_upgrade2(ctx->h2, binsettings, binlen,
                                  data->state.httpreq == HTTPREQ_HEAD,
                                  NULL);
    if(rc) {
      failf(data, "nghttp2_session_upgrade2() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
      result = CURLE_HTTP2;
      goto out;
    }

    rc = nghttp2_session_set_stream_user_data(ctx->h2, stream->id,
                                              data);
    if(rc) {
      infof(data, "http/2: failed to set user_data for stream %u",
            stream->id);
      DEBUGASSERT(0);
    }
    CURL_TRC_CF(data, cf, "created session via Upgrade");
  }
  else {
    nghttp2_settings_entry iv[H2_SETTINGS_IV_LEN];
    int ivlen;

    ivlen = populate_settings(iv, data);
    rc = nghttp2_submit_settings(ctx->h2, NGHTTP2_FLAG_NONE,
                                 iv, ivlen);
    if(rc) {
      failf(data, "nghttp2_submit_settings() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
      result = CURLE_HTTP2;
      goto out;
    }
  }

  rc = nghttp2_session_set_local_window_size(ctx->h2, NGHTTP2_FLAG_NONE, 0,
                                             HTTP2_HUGE_WINDOW_SIZE);
  if(rc) {
    failf(data, "nghttp2_session_set_local_window_size() failed: %s(%d)",
          nghttp2_strerror(rc), rc);
    result = CURLE_HTTP2;
    goto out;
  }

  /* all set, traffic will be send on connect */
  result = CURLE_OK;
  CURL_TRC_CF(data, cf, "[0] created h2 session%s",
              via_h1_upgrade? " (via h1 upgrade)" : "");

out:
  if(cbs)
    nghttp2_session_callbacks_del(cbs);
  return result;
}